

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O1

void show_allocate(CHAR_DATA *ch,int finish)

{
  short sVar1;
  char buf [4608];
  
  if (finish == 0) {
    write_to_buffer(ch->desc,
                    "Type \'<str/int/wis/dex/con> <amount>\' to modify a particular stat.\n\r",0);
    write_to_buffer(ch->desc,
                    "The default amount is 1, use negative numbers to deallocate points.\n\r",0);
    write_to_buffer(ch->desc,"Type \'finish\' when you\'re done.\n\r",0);
    write_to_buffer(ch->desc,"\n\rTime to allocate points to your stats.\n\r",0);
  }
  sprintf(buf,"You have %d points to allocate.\n\r",(ulong)(uint)(int)ch->train);
  write_to_buffer(ch->desc,buf,0);
  sVar1 = ch->race;
  sprintf(buf,
          "Your stats: Str: %d (Max %d)  Int: %d (Max %d)  Wis: %d (Max %d)  Dex: %d (Max %d)  Con: %d (Max %d)\n\r"
          ,(ulong)(uint)(int)ch->perm_stat[0],(ulong)(uint)(int)pc_race_table[sVar1].max_stats[0],
          (ulong)(uint)(int)ch->perm_stat[1],(ulong)(uint)(int)pc_race_table[sVar1].max_stats[1],
          (ulong)(uint)(int)ch->perm_stat[2],(ulong)(uint)(int)pc_race_table[sVar1].max_stats[2],
          (ulong)(uint)(int)ch->perm_stat[3],(ulong)(uint)(int)pc_race_table[sVar1].max_stats[3],
          (ulong)(uint)(int)ch->perm_stat[4],(ulong)(uint)(int)pc_race_table[sVar1].max_stats[4]);
  send_to_char(buf,ch);
  write_to_buffer(ch->desc,"> ",0);
  return;
}

Assistant:

void show_allocate(CHAR_DATA *ch, int finish)
{
	char buf[MSL];

	if (!finish)
	{
		write_to_buffer(ch->desc, "Type '<str/int/wis/dex/con> <amount>' to modify a particular stat.\n\r", 0);
		write_to_buffer(ch->desc, "The default amount is 1, use negative numbers to deallocate points.\n\r", 0);
		write_to_buffer(ch->desc, "Type 'finish' when you're done.\n\r", 0);
		write_to_buffer(ch->desc, "\n\rTime to allocate points to your stats.\n\r", 0);
	}

	sprintf(buf, "You have %d points to allocate.\n\r", ch->train);
	write_to_buffer(ch->desc, buf, 0);

	sprintf(buf, "Your stats: Str: %d (Max %d)  Int: %d (Max %d)  Wis: %d (Max %d)  Dex: %d (Max %d)  Con: %d (Max %d)\n\r",
		ch->perm_stat[STAT_STR],
		pc_race_table[ch->race].max_stats[STAT_STR],
		ch->perm_stat[STAT_INT],
		pc_race_table[ch->race].max_stats[STAT_INT],
		ch->perm_stat[STAT_WIS],
		pc_race_table[ch->race].max_stats[STAT_WIS],
		ch->perm_stat[STAT_DEX],
		pc_race_table[ch->race].max_stats[STAT_DEX],
		ch->perm_stat[STAT_CON],
		pc_race_table[ch->race].max_stats[STAT_CON]);
	send_to_char(buf, ch);

	write_to_buffer(ch->desc, "> ", 0);
}